

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btCollisionWorldImporter.cpp
# Opt level: O2

char * __thiscall btCollisionWorldImporter::duplicateName(btCollisionWorldImporter *this,char *name)

{
  int iVar1;
  size_t sVar2;
  char *__dest;
  ulong uVar3;
  char *newName;
  
  if (name != (char *)0x0) {
    sVar2 = strlen(name);
    iVar1 = (int)sVar2;
    uVar3 = 0xffffffffffffffff;
    if (-1 < (long)(iVar1 + 1)) {
      uVar3 = (long)(iVar1 + 1);
    }
    __dest = (char *)operator_new__(uVar3);
    newName = __dest;
    memcpy(__dest,name,(long)iVar1);
    __dest[iVar1] = '\0';
    btAlignedObjectArray<char_*>::push_back(&this->m_allocatedNames,&newName);
    return newName;
  }
  return (char *)0x0;
}

Assistant:

char* btCollisionWorldImporter::duplicateName(const char* name)
{
	if (name)
	{
		int l = (int)strlen(name);
		char* newName = new char[l+1];
		memcpy(newName,name,l);
		newName[l] = 0;
		m_allocatedNames.push_back(newName);
		return newName;
	}
	return 0;
}